

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O2

string * __thiscall
sentencepiece::util::StrError_abi_cxx11_(string *__return_storage_ptr__,util *this,int errnum)

{
  char *pcVar1;
  ostream *poVar2;
  ostringstream os;
  char buffer [1024];
  ostringstream local_5a0 [376];
  char local_428 [1032];
  
  pcVar1 = strerror_r((int)this,local_428,0x3ff);
  std::__cxx11::ostringstream::ostringstream(local_5a0);
  poVar2 = std::operator<<((ostream *)local_5a0,pcVar1);
  poVar2 = std::operator<<(poVar2," Error #");
  std::ostream::operator<<(poVar2,(int)this);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_5a0);
  return __return_storage_ptr__;
}

Assistant:

std::string StrError(int errnum) {
  constexpr int kStrErrorSize = 1024;
  char buffer[kStrErrorSize];
  char *str = nullptr;
#if defined(__GLIBC__) && defined(_GNU_SOURCE)
  str = strerror_r(errnum, buffer, kStrErrorSize - 1);
#elif defined(_WIN32)
  strerror_s(buffer, kStrErrorSize - 1, errnum);
  str = buffer;
#else
  strerror_r(errnum, buffer, kStrErrorSize - 1);
  str = buffer;
#endif
  std::ostringstream os;
  os << str << " Error #" << errnum;
  return os.str();
}